

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::roundToIntegral(DoubleAPFloat *this,roundingMode RM)

{
  opStatus oVar1;
  APFloat Tmp;
  DoubleAPFloat DStack_68;
  APInt local_58;
  APFloat local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt(&DStack_68);
    IEEEFloat::IEEEFloat
              (&local_48.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&DStack_68);
    APInt::~APInt((APInt *)&DStack_68);
    oVar1 = APFloat::roundToIntegral(&local_48,RM);
    APFloat::bitcastToAPInt((APFloat *)&local_58);
    DoubleAPFloat(&DStack_68,(fltSemantics *)semPPCDoubleDouble,&local_58);
    operator=(this,&DStack_68);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              (&DStack_68.Floats);
    APInt::~APInt(&local_58);
    APFloat::Storage::~Storage((Storage *)&local_48.U.IEEE);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1052,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::roundToIntegral(APFloat::roundingMode)"
               );
}

Assistant:

APFloat::opStatus DoubleAPFloat::roundToIntegral(APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.roundToIntegral(RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}